

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_SetShapeBlendEquation(GPU_BlendEqEnum color_equation,GPU_BlendEqEnum alpha_equation)

{
  GPU_Context *pGVar1;
  
  if ((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
     (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) {
    pGVar1 = _gpu_current_renderer->current_context_target->context;
    (pGVar1->shapes_blend_mode).color_equation = color_equation;
    (pGVar1->shapes_blend_mode).alpha_equation = alpha_equation;
  }
  return;
}

Assistant:

void GPU_SetShapeBlendEquation(GPU_BlendEqEnum color_equation, GPU_BlendEqEnum alpha_equation)
{
    GPU_Context* context;
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL)
        return;

    context = _gpu_current_renderer->current_context_target->context;

    context->shapes_blend_mode.color_equation = color_equation;
    context->shapes_blend_mode.alpha_equation = alpha_equation;
}